

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1373::run(TestCase1373 *this)

{
  bool bVar1;
  char *in_RCX;
  SegmentBuilder *pSVar2;
  uint i_1;
  uint index;
  long lVar3;
  uint i;
  long lVar4;
  Builder BVar5;
  Reader RVar6;
  Reader RVar7;
  Reader copyFrom;
  char local_204 [4];
  ArrayPtr<const_char> local_200;
  ArrayDisposer *local_1f0;
  ArrayPtr<const_char> local_1e8;
  Orphan<capnp::Data> orphan2;
  Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_> orphan;
  ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> reader;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> builder;
  Vector<capnp::Orphan<capnp::Text>_> pointers;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  pointers.builder.ptr =
       kj::_::HeapArrayDisposer::allocateUninitialized<capnp::Orphan<capnp::Text>>(7);
  pointers.builder.endPtr = pointers.builder.ptr + 7;
  pointers.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pointers.builder.pos = pointers.builder.ptr;
  for (orphan2.builder.tag.content._0_4_ = 0; (uint)orphan2.builder.tag.content < 7;
      orphan2.builder.tag.content._0_4_ = (uint)orphan2.builder.tag.content + 1) {
    orphan.builder._0_16_ = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
    kj::str<char_const(&)[4],unsigned_int&>
              ((String *)&builder,(kj *)"foo",(char (*) [4])&orphan2,(uint *)in_RCX);
    pSVar2 = (SegmentBuilder *)0x32afa1;
    if (builder.builder.capTable != (CapTableBuilder *)0x0) {
      pSVar2 = builder.builder.segment;
    }
    copyFrom.super_StringPtr.content.size_ =
         (uint *)((long)&((builder.builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
                 (ulong)(builder.builder.capTable == (CapTableBuilder *)0x0));
    copyFrom.super_StringPtr.content.ptr = (char *)pSVar2;
    Orphanage::newOrphanCopy<capnp::Text::Reader>
              ((Orphan<capnp::Text> *)&reader,(Orphanage *)&orphan,copyFrom);
    kj::Vector<capnp::Orphan<capnp::Text>>::add<capnp::Orphan<capnp::Text>>
              ((Vector<capnp::Orphan<capnp::Text>> *)&pointers,(Orphan<capnp::Text> *)&reader);
    OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&reader);
    kj::Array<char>::~Array((Array<char> *)&builder);
    in_RCX = (char *)copyFrom.super_StringPtr.content.size_;
  }
  reader.reader._0_16_ = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  index = 7;
  Orphanage::newOrphan<capnp::List<capnp::Text,(capnp::Kind)1>>(&orphan,(Orphanage *)&reader,7);
  OrphanGetImpl<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::apply
            (&builder,&orphan.builder);
  lVar3 = 0;
  for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
    List<capnp::Text,_(capnp::Kind)1>::Builder::adopt
              (&builder,(uint)lVar4,
               (Orphan<capnp::Text> *)((long)&((pointers.builder.ptr)->builder).tag.content + lVar3)
              );
    lVar3 = lVar3 + 0x20;
  }
  reader.reader._0_16_ = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnp::Data>(&orphan2,(Orphanage *)&reader,1);
  BVar5 = OrphanBuilder::asData(&orphan2.builder);
  *BVar5.super_ArrayPtr<unsigned_char>.ptr = ' ';
  OrphanGetImpl<capnp::Text,_(capnp::Kind)1>::truncateListOf(&orphan.builder,0xb);
  OrphanGetImpl<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::applyReader
            (&reader,&orphan.builder);
  if ((reader.reader.elementCount != 0xb) &&
     (in_RCX = (char *)&kj::_::Debug::minSeverity, kj::_::Debug::minSeverity < 3)) {
    local_200.ptr._0_4_ = 0xb;
    local_1e8.ptr._0_4_ = reader.reader.elementCount;
    in_RCX = "\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()";
    kj::_::Debug::log<char_const(&)[41],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x572,ERROR,"\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()",
               (char (*) [41])"failed: expected (11) == (reader.size())",(int *)&local_200,
               (uint *)&local_1e8);
  }
  local_204[0] = '\0';
  local_204[1] = '\0';
  local_204[2] = '\0';
  local_204[3] = '\0';
  for (; (uint)local_204 < 7; local_204 = (char  [4])((int)local_204 + 1)) {
    kj::str<char_const(&)[4],unsigned_int&>
              ((String *)&local_200,(kj *)"foo",&local_204,(uint *)in_RCX);
    local_1e8 = (ArrayPtr<const_char>)
                List<capnp::Text,_(capnp::Kind)1>::Reader::operator[](&reader,(uint)local_204);
    bVar1 = kj::String::operator==((String *)&local_200,(StringPtr *)&local_1e8);
    kj::Array<char>::~Array((Array<char> *)&local_200);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::str<char_const(&)[4],unsigned_int&>
                ((String *)&local_200,(kj *)"foo",&local_204,(uint *)in_RCX);
      local_1e8 = (ArrayPtr<const_char>)
                  List<capnp::Text,_(capnp::Kind)1>::Reader::operator[](&reader,(uint)local_204);
      in_RCX = 
      "\"failed: expected \" \"(kj::str(\\\"foo\\\", i)) == (reader[i])\", kj::str(\"foo\", i), reader[i]"
      ;
      kj::_::Debug::log<char_const(&)[52],kj::String,capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x575,ERROR,
                 "\"failed: expected \" \"(kj::str(\\\"foo\\\", i)) == (reader[i])\", kj::str(\"foo\", i), reader[i]"
                 ,(char (*) [52])"failed: expected (kj::str(\"foo\", i)) == (reader[i])",
                 (String *)&local_200,(Reader *)&local_1e8);
      kj::Array<char>::~Array((Array<char> *)&local_200);
    }
    List<capnp::Text,_(capnp::Kind)1>::Builder::operator[]
              ((Builder *)&local_200,&builder,(uint)local_204);
    if (((ArrayDisposer *)0x1 < local_1f0) && (kj::_::Debug::minSeverity < 3)) {
      in_RCX = "\"failed: expected \" \"builder[i] == nullptr\"";
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x576,ERROR,"\"failed: expected \" \"builder[i] == nullptr\"",
                 (char (*) [39])"failed: expected builder[i] == nullptr");
    }
  }
  for (; index != 0xb; index = index + 1) {
    RVar6 = List<capnp::Text,_(capnp::Kind)1>::Reader::operator[](&reader,index);
    if ((1 < RVar6.super_StringPtr.content.size_) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x579,ERROR,"\"failed: expected \" \"reader[i] == nullptr\"",
                 (char (*) [38])"failed: expected reader[i] == nullptr");
    }
  }
  RVar6.super_StringPtr.content.size_ = 4;
  RVar6.super_StringPtr.content.ptr = "bar";
  List<capnp::Text,_(capnp::Kind)1>::Builder::set(&builder,0,RVar6);
  local_200 = (ArrayPtr<const_char>)List<capnp::Text,_(capnp::Kind)1>::Reader::operator[](&reader,0)
  ;
  bVar1 = kj::operator==("foo0",(StringPtr *)&local_200);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_200 = (ArrayPtr<const_char>)
                List<capnp::Text,_(capnp::Kind)1>::Reader::operator[](&reader,0);
    kj::_::Debug::log<char_const(&)[41],char_const(&)[5],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x57f,ERROR,
               "\"failed: expected \" \"(\\\"foo0\\\") == (reader[0])\", \"foo0\", reader[0]",
               (char (*) [41])"failed: expected (\"foo0\") == (reader[0])",(char (*) [5])"foo0",
               (Reader *)&local_200);
  }
  RVar7 = OrphanBuilder::asDataReader(&orphan2.builder);
  if ((*RVar7.super_ArrayPtr<const_unsigned_char>.ptr != ' ') && (kj::_::Debug::minSeverity < 3)) {
    local_200.ptr._0_4_ = 0x20;
    RVar7 = OrphanBuilder::asDataReader(&orphan2.builder);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x581,ERROR,
               "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
               ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",(int *)&local_200
               ,RVar7.super_ArrayPtr<const_unsigned_char>.ptr);
  }
  OrphanBuilder::~OrphanBuilder(&orphan2.builder);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  kj::ArrayBuilder<capnp::Orphan<capnp::Text>_>::dispose(&pointers.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendPointerListCopy) {
  MallocMessageBuilder message;

  // Allocate data in advance so that the list itself is at the end of the segment.
  kj::Vector<Orphan<Text>> pointers(7);
  for (uint i = 0; i < 7; i++) {
    pointers.add(message.getOrphanage().newOrphanCopy(Text::Reader(kj::str("foo", i))));
  }

  auto orphan = message.getOrphanage().newOrphan<List<Text>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.adopt(i, kj::mv(pointers[i]));
  }

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(11);

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(kj::str("foo", i), reader[i]);
    EXPECT_TRUE(builder[i] == nullptr);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_TRUE(reader[i] == nullptr);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, "bar");
  EXPECT_EQ("foo0", reader[0]);

  EXPECT_EQ(32, orphan2.getReader()[0]);
}